

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O0

int lib::math::Modf(State *state)

{
  bool bVar1;
  State *in_RDI;
  double __x;
  StackAPI *this;
  double fpart;
  double ipart;
  StackAPI api;
  double in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  StackAPI *in_stack_ffffffffffffffd8;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                     (ValueT)in_stack_ffffffffffffffd0);
  if (bVar1) {
    __x = luna::StackAPI::GetNumber((StackAPI *)0x0,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20))
    ;
    this = (StackAPI *)modf(__x,(double *)&stack0xffffffffffffffd8);
    luna::StackAPI::PushNumber(this,in_stack_ffffffffffffffc8);
    luna::StackAPI::PushNumber(this,in_stack_ffffffffffffffc8);
    local_4 = 2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Modf(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Number))
            return 0;

        double ipart = 0.0;
        auto fpart = std::modf(api.GetNumber(0), &ipart);
        api.PushNumber(ipart);
        api.PushNumber(fpart);
        return 2;
    }